

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O1

bool __thiscall helics::MultiBroker::brokerConnect(MultiBroker *this)

{
  CoreType type;
  pointer pcVar1;
  CommsInterface *pCVar2;
  size_type sVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Option *pOVar8;
  CoreType CVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  int *piVar11;
  sockaddr *__addr;
  sockaddr *__addr_00;
  milliseconds mVar12;
  short sVar13;
  undefined8 uVar14;
  bool bVar15;
  string_view localAddress;
  string_view name;
  string_view name_00;
  string localConfigString;
  unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> comm;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3c0;
  undefined1 local_3b8 [80];
  _Any_data local_368;
  _Manager_type local_358;
  code *pcStack_350;
  _Any_data local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  _Any_data local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  _Any_data local_2a8;
  _Manager_type local_298;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined3 uStack_284;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270 [10];
  vector<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>,std::allocator<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>>
  *local_1d0;
  string *local_1c8;
  BrokerBase *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  int *local_1b0;
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  string local_188;
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  string local_128;
  undefined1 local_108 [32];
  string local_e8;
  string local_c8;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_98;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_78;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                 "--config=\'",&this->configFile);
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_348,local_348._8_8_,0,1,'\'');
  local_3b8._32_8_ = local_3b8 + 0x30;
  pcVar1 = (pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar10) {
    local_3b8._48_8_ = paVar10->_M_allocated_capacity;
    local_3b8._56_8_ = *(size_type *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_3b8._48_8_ = paVar10->_M_allocated_capacity;
    local_3b8._32_8_ = pcVar1;
  }
  local_3b8._40_8_ = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_unused._0_8_ != &local_338) {
    operator_delete(local_348._M_unused._M_object,
                    CONCAT71(local_338._M_allocated_capacity._1_7_,local_338._M_local_buf[0]) + 1);
  }
  CVar9 = (CoreType)paVar10;
  if ((this->configFile)._M_string_length == 0) {
    if (this->type == MULTI) {
      this->type = DEFAULT;
    }
    local_3c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    uVar14 = (helicsCLI11App *)0x0;
  }
  else {
    CVar9 = 0x469b5c;
    localAddress._M_str = (char *)0x0;
    localAddress._M_len = (size_t)&this->netInfo;
    NetworkBrokerData::commandLineParser((NetworkBrokerData *)&local_348,localAddress,true);
    uVar14 = local_348._M_unused._0_8_;
    local_3c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_;
    local_348 = (_Any_data)0x0;
    helicsCLI11App::addTypeOption((helicsCLI11App *)uVar14,true);
    *(config_extras_mode *)(uVar14 + 0x49) = error;
  }
  local_3b8._72_8_ = uVar14;
  if (this->type == MULTI) {
    CLI::App::get_config_formatter_base((App *)local_3b8);
    uVar5 = local_3b8._0_8_;
    local_348._M_unused._M_object = &local_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"master","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar5 + 0x30),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != &local_338) {
      operator_delete(local_348._M_unused._M_object,
                      CONCAT71(local_338._M_allocated_capacity._1_7_,local_338._M_local_buf[0]) + 1)
      ;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
    }
    ((helicsCLI11App *)uVar14)->coreType = this->type;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_3b8._32_8_,(pointer)(local_3b8._40_8_ + local_3b8._32_8_));
    CLI::App::parse((App *)uVar14,&local_c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    this->type = ((helicsCLI11App *)uVar14)->coreType;
  }
  if (this->type != MULTI) {
    if ((this->netInfo).brokerAddress._M_string_length == 0 &&
        (this->netInfo).brokerName._M_string_length == 0) {
      CoreBroker::setAsRoot(&this->super_CoreBroker);
    }
    CommFactory::create((CommFactory *)local_348._M_pod_data,this->type);
    uVar5 = local_348._M_unused._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_348._8_8_;
    local_348 = (_Any_data)(auVar4 << 0x40);
    pCVar2 = (this->masterComm)._M_t.
             super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
             .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl;
    (this->masterComm)._M_t.
    super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>._M_t
    .super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>.
    super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl = (CommsInterface *)uVar5;
    if (pCVar2 != (CommsInterface *)0x0) {
      (*pCVar2->_vptr_CommsInterface[1])();
    }
    if ((long *)local_348._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_348._M_unused._M_object + 8))();
    }
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = this;
    pcStack_40 = CLI::std::
                 _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:113:37)>
                 ::_M_invoke;
    local_48 = CLI::std::
               _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:113:37)>
               ::_M_manager;
    CommsInterface::setCallback
              ((this->masterComm)._M_t.
               super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
               .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,
               (function<void_(helics::ActionMessage_&&)> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
    }
    pCVar2 = (this->masterComm)._M_t.
             super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
             .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl;
    BrokerBase::getLoggingCallback(&(this->super_CoreBroker).super_BrokerBase);
    CommsInterface::setLoggingCallback(pCVar2,&local_78);
    if ((element_type *)local_78.super__Function_base._M_manager != (element_type *)0x0) {
      (*local_78.super__Function_base._M_manager)(&local_78,&local_78,3);
    }
    CommsInterface::setName
              ((this->masterComm)._M_t.
               super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
               .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,
               (string *)&(this->super_CoreBroker).super_BrokerBase.identifier);
    pCVar2 = (this->masterComm)._M_t.
             super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
             .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl;
    (*pCVar2->_vptr_CommsInterface[2])(pCVar2,&this->netInfo);
    mVar12.__r = (this->super_CoreBroker).super_BrokerBase.networkTimeout.internalTimeCode / 1000000
    ;
    CommsInterface::setTimeout
              ((this->masterComm)._M_t.
               super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
               .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,mVar12);
    iVar6 = CommsInterface::connect
                      ((this->masterComm)._M_t.
                       super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
                       .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,
                       (int)mVar12.__r,__addr,CVar9);
    if ((char)iVar6 == '\0') {
      bVar15 = false;
      goto LAB_001c3f9f;
    }
    name._M_str._0_4_ = this->type;
    name._M_len = (size_t)(this->super_CoreBroker).super_BrokerBase.identifier._M_dataplus._M_p;
    name._M_str._4_4_ = 0;
    BrokerFactory::addAssociatedBrokerType
              ((BrokerFactory *)
               (this->super_CoreBroker).super_BrokerBase.identifier._M_string_length,name,CVar9);
  }
  sVar3 = (this->configFile)._M_string_length;
  bVar15 = sVar3 != 0;
  if (bVar15) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"--broker","");
    pOVar8 = CLI::App::get_option((App *)uVar14,&local_e8);
    CLI::App::remove_option((App *)uVar14,pOVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    local_108._0_8_ = (_Base_ptr)(local_108 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"--brokerport","");
    pOVar8 = CLI::App::get_option((App *)uVar14,(string *)local_108);
    CLI::App::remove_option((App *)uVar14,pOVar8);
    if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
    }
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"--brokername","");
    pOVar8 = CLI::App::get_option((App *)uVar14,&local_128);
    CLI::App::remove_option((App *)uVar14,pOVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    local_148._0_8_ = (_Base_ptr)(local_148 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"--brokeraddress","");
    pOVar8 = CLI::App::get_option((App *)uVar14,(string *)local_148);
    CLI::App::remove_option((App *)uVar14,pOVar8);
    if ((_Base_ptr)local_148._0_8_ != (_Base_ptr)(local_148 + 0x10)) {
      operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
    }
    local_168._0_8_ = (_Base_ptr)(local_168 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"--autobroker","");
    pOVar8 = CLI::App::get_option((App *)uVar14,(string *)local_168);
    CLI::App::remove_option((App *)uVar14,pOVar8);
    if ((_Base_ptr)local_168._0_8_ != (_Base_ptr)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    if (sVar3 != 0) {
      local_3b8._64_8_ = &this->netInfo;
      local_190 = &(this->netInfo).brokerAddress;
      local_198 = (_Base_ptr)&(this->netInfo).localInterface;
      local_1a0 = (_Base_ptr)&(this->netInfo).brokerInitString;
      local_1a8 = (_Base_ptr)&(this->netInfo).connectionAddress;
      local_1b0 = &(this->netInfo).portNumber;
      local_1b8 = &(this->netInfo).encryptionConfig;
      local_1c0 = &(this->super_CoreBroker).super_BrokerBase;
      local_1c8 = (string *)&(this->super_CoreBroker).super_BrokerBase.identifier;
      local_1d0 = (vector<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>,std::allocator<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>>
                   *)&this->comms;
      sVar13 = 0;
      do {
        memset(&local_348,0,0xf0);
        local_348._8_8_ = 0;
        local_348._M_unused._M_object = &local_338;
        local_338._M_local_buf[0] = '\0';
        local_328._M_unused._M_object = &local_318;
        local_328._8_8_ = 0;
        local_318._M_local_buf[0] = '\0';
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        local_308._M_string_length = 0;
        local_308.field_2._M_local_buf[0] = '\0';
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        local_2e8._M_string_length = 0;
        local_2e8.field_2._M_local_buf[0] = '\0';
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        local_2c8._M_string_length = 0;
        local_2c8.field_2._M_local_buf[0] = '\0';
        local_2a8._0_4_ = 0xffffffff;
        local_2a8._4_4_ = 0xffffffff;
        local_2a8._8_4_ = 0xffffffff;
        local_2a8._12_4_ = 0xffffffff;
        local_298 = (_Manager_type)0x10000001000;
        uStack_290 = 5;
        uStack_28c = 0;
        uStack_288 = 0;
        uStack_284 = 0;
        local_280._8_8_ = 0;
        local_270[0]._M_local_buf[0] = '\0';
        local_270[1]._0_1_ = IP;
        local_280._0_8_ = local_270;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_3b8._64_8_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(local_190,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                  &local_308);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                  &local_2e8);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                  &local_2c8);
        *(ulong *)local_1b0 = CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
        *(ulong *)(local_1b0 + 2) = CONCAT44(local_2a8._12_4_,local_2a8._8_4_);
        *(_Manager_type *)(local_1b0 + 4) = local_298;
        *(ulong *)(local_1b0 + 6) = CONCAT44(uStack_28c,uStack_290);
        *(ulong *)((long)local_1b0 + 0x1f) =
             CONCAT35(uStack_284,CONCAT41(uStack_288,uStack_28c._3_1_));
        piVar11 = local_1b0;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(local_1b8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
        CVar9 = (CoreType)piVar11;
        (this->netInfo).allowedType = local_270[1]._0_1_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._0_8_ != local_270) {
          operator_delete((void *)local_280._0_8_,
                          CONCAT71(local_270[0]._M_allocated_capacity._1_7_,
                                   local_270[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,
                          CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                                   local_2c8.field_2._M_local_buf[0]) + 1);
        }
        uVar14 = local_3b8._72_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,
                          CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                   local_2e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,
                          CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                                   local_308.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_unused._0_8_ != &local_318) {
          operator_delete(local_328._M_unused._M_object,
                          CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_unused._0_8_ != &local_338) {
          operator_delete(local_348._M_unused._M_object,
                          CONCAT71(local_338._M_allocated_capacity._1_7_,local_338._M_local_buf[0])
                          + 1);
        }
        CLI::App::get_config_formatter_base((App *)local_3b8);
        uVar5 = local_3b8._0_8_;
        local_348._M_unused._M_object = &local_338;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"comms","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (uVar5 + 0x30),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348);
        *(short *)(uVar5 + 0x2a) = sVar13;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_unused._0_8_ != &local_338) {
          operator_delete(local_348._M_unused._M_object,
                          CONCAT71(local_338._M_allocated_capacity._1_7_,local_338._M_local_buf[0])
                          + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
        }
        *(CoreType *)(uVar14 + 0x398) = MULTI;
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,local_3b8._32_8_,
                   (pointer)(local_3b8._40_8_ + local_3b8._32_8_));
        CLI::App::parse((App *)uVar14,&local_188,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        type = *(CoreType *)(uVar14 + 0x398);
        this->type = type;
        if (type == MULTI) {
          bVar15 = false;
        }
        else {
          CommFactory::create((CommFactory *)local_348._M_pod_data,type);
          local_368._8_2_ = sVar13;
          local_368._M_unused._M_object = this;
          local_368._10_6_ = 0;
          pcStack_350 = CLI::std::
                        _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:144:35)>
                        ::_M_invoke;
          local_358 = CLI::std::
                      _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:144:35)>
                      ::_M_manager;
          CommsInterface::setCallback
                    ((CommsInterface *)local_348._M_unused._0_8_,
                     (function<void_(helics::ActionMessage_&&)> *)&local_368);
          if (local_358 != (_Manager_type)0x0) {
            (*local_358)(&local_368,&local_368,__destroy_functor);
          }
          uVar14 = local_348._M_unused._0_8_;
          BrokerBase::getLoggingCallback(local_1c0);
          CommsInterface::setLoggingCallback((CommsInterface *)uVar14,&local_98);
          if ((pointer)local_98.super__Function_base._M_manager != (pointer)0x0) {
            (*local_98.super__Function_base._M_manager)(&local_98,&local_98,3);
          }
          CommsInterface::setName((CommsInterface *)local_348._M_unused._0_8_,local_1c8);
          (**(code **)(*local_348._M_unused._M_object + 0x10))
                    (local_348._M_unused._M_object,local_3b8._64_8_);
          mVar12.__r = (this->super_CoreBroker).super_BrokerBase.networkTimeout.internalTimeCode /
                       1000000;
          CommsInterface::setTimeout((CommsInterface *)local_348._M_unused._0_8_,mVar12);
          iVar6 = CommsInterface::connect
                            ((CommsInterface *)local_348._M_unused._0_8_,(int)mVar12.__r,__addr_00,
                             CVar9);
          std::
          vector<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>,std::allocator<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>>
          ::
          emplace_back<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>
                    (local_1d0,
                     (unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                      *)&local_348);
          if ((char)iVar6 == '\0') {
            (*(this->super_CoreBroker).super_Broker._vptr_Broker[0x21])(this);
          }
          else {
            name_00._M_str._0_4_ = this->type;
            name_00._M_len =
                 (size_t)(this->super_CoreBroker).super_BrokerBase.identifier._M_dataplus._M_p;
            name_00._M_str._4_4_ = 0;
            BrokerFactory::addAssociatedBrokerType
                      ((BrokerFactory *)
                       (this->super_CoreBroker).super_BrokerBase.identifier._M_string_length,name_00
                       ,CVar9);
          }
          if ((long *)local_348._M_unused._0_8_ != (long *)0x0) {
            (**(code **)(*local_348._M_unused._M_object + 8))();
          }
          if ((char)iVar6 == '\0') break;
        }
        sVar13 = sVar13 + 1;
      } while (bVar15);
    }
  }
  bVar15 = (bool)(bVar15 ^ 1);
LAB_001c3f9f:
  if ((undefined1 *)local_3b8._32_8_ != local_3b8 + 0x30) {
    operator_delete((void *)local_3b8._32_8_,local_3b8._48_8_ + 1);
  }
  if (local_3c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0);
  }
  return bVar15;
}

Assistant:

bool MultiBroker::brokerConnect()
{
    std::shared_ptr<helicsCLI11App> app;
    const std::string localConfigString = "--config='" + configFile + '\'';
    if (!configFile.empty()) {
        app = netInfo.commandLineParser("");
        app->addTypeOption();
        app->allow_config_extras(CLI::config_extras_mode::error);
    } else if (type == CoreType::MULTI) {
        type = CoreType::DEFAULT;
    }
    try {
        if (type == CoreType::MULTI) {
            app->get_config_formatter_base()->section("master");
            app->setDefaultCoreType(type);
            app->parse(localConfigString);
            type = app->getCoreType();
        }
        if (type != CoreType::MULTI) {
            if ((netInfo.brokerName.empty()) && (netInfo.brokerAddress.empty())) {
                CoreBroker::setAsRoot();
            }
            masterComm = CommFactory::create(type);
            masterComm->setCallback([this](ActionMessage&& message) {
                BrokerBase::addActionMessage(std::move(message));
            });
            masterComm->setLoggingCallback(BrokerBase::getLoggingCallback());
            masterComm->setName(getIdentifier());
            masterComm->loadNetworkInfo(netInfo);
            masterComm->setTimeout(networkTimeout.to_ms());

            if (!masterComm->connect()) {
                return false;
            }
            BrokerFactory::addAssociatedBrokerType(getIdentifier(), type);
        }
        bool moreComms = (!configFile.empty());
        if (moreComms) {
            // remove options that are used to specify a broker
            app->remove_option(app->get_option("--broker"));
            app->remove_option(app->get_option("--brokerport"));
            app->remove_option(app->get_option("--brokername"));
            app->remove_option(app->get_option("--brokeraddress"));
            app->remove_option(app->get_option("--autobroker"));
        }
        uint16_t index = 0;
        while (moreComms) {
            netInfo = NetworkBrokerData();  // to reset the networkBrokerData
            app->get_config_formatter_base()->section("comms")->index(index);
            app->setDefaultCoreType(CoreType::MULTI);
            app->parse(localConfigString);
            type = app->getCoreType();
            if (type != CoreType::MULTI) {
                auto comm = CommFactory::create(type);
                comm->setCallback([this, index](ActionMessage&& message) {
                    if (message.action() == CMD_REG_BROKER) {
                        message.setExtraData(index + 1);
                    }
                    BrokerBase::addActionMessage(std::move(message));
                });
                comm->setLoggingCallback(BrokerBase::getLoggingCallback());
                comm->setName(getIdentifier());
                comm->loadNetworkInfo(netInfo);
                comm->setTimeout(networkTimeout.to_ms());

                const bool res = comm->connect();
                comms.push_back(std::move(comm));
                if (!res) {
                    brokerDisconnect();
                    return false;
                }
                BrokerFactory::addAssociatedBrokerType(getIdentifier(), type);
            } else {
                moreComms = false;
            }
            ++index;
        }
    }
    catch (const CLI::Error& e) {
        std::ostringstream oss;
        app->exit(e, oss, oss);
        sendToLogger(parent_broker_id, HELICS_LOG_LEVEL_ERROR, getIdentifier(), oss.str());
        brokerDisconnect();
        return false;
    }
    catch (...) {
        brokerDisconnect();
        return false;
    }
    return true;
}